

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  int iVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  char *__s;
  char *__s_00;
  ImVec2 *pIVar4;
  ImVec2 *in_RDX;
  ImVec2 *in_RSI;
  long in_RDI;
  bool bVar5;
  int indentation;
  int line_length;
  bool is_last_line;
  char *line_end;
  char *line_start;
  char *text_remaining;
  int tree_depth;
  bool log_new_line;
  char *suffix;
  char *prefix;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  uint local_84;
  ImVec2 *local_48;
  ImGuiContext *text_end_00;
  ImVec2 *ref_pos_00;
  
  text_end_00 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  __s = GImGui->LogNextPrefix;
  __s_00 = GImGui->LogNextSuffix;
  GImGui->LogNextSuffix = (char *)0x0;
  text_end_00->LogNextPrefix = (char *)0x0;
  local_48 = in_RSI;
  if (in_RDX == (ImVec2 *)0x0) {
    in_RDX = (ImVec2 *)FindRenderedTextEnd((char *)in_RSI,(char *)0x0);
    local_48 = in_RSI;
  }
  bVar5 = false;
  if (in_RDI != 0) {
    bVar5 = text_end_00->LogLinePosY + (text_end_00->Style).FramePadding.y + 1.0 <
            *(float *)(in_RDI + 4);
    text_end_00->LogLinePosY = *(float *)(in_RDI + 4);
  }
  if (bVar5) {
    LogText("\n");
    text_end_00->LogLineFirstItem = true;
  }
  if (__s != (char *)0x0) {
    strlen(__s);
    LogRenderedText(local_48,(char *)in_RDX,&text_end_00->Initialized);
  }
  if ((pIVar3->DC).TreeDepth < text_end_00->LogDepthRef) {
    text_end_00->LogDepthRef = (pIVar3->DC).TreeDepth;
  }
  iVar1 = (pIVar3->DC).TreeDepth;
  iVar2 = text_end_00->LogDepthRef;
  ref_pos_00 = local_48;
  while( true ) {
    pIVar4 = (ImVec2 *)ImStreolRange(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    bVar5 = pIVar4 == in_RDX;
    if ((local_48 != pIVar4) || (!bVar5)) {
      if ((text_end_00->LogLineFirstItem & 1U) == 0) {
        local_84 = 1;
      }
      else {
        local_84 = (iVar1 - iVar2) * 4;
      }
      LogText("%*s%.*s",(ulong)local_84,"",(ulong)(uint)((int)pIVar4 - (int)local_48),local_48);
      text_end_00->LogLineFirstItem = false;
      if (*(char *)&pIVar4->x == '\n') {
        LogText("\n");
        text_end_00->LogLineFirstItem = true;
      }
    }
    if (bVar5) break;
    local_48 = (ImVec2 *)((long)&pIVar4->x + 1);
  }
  if (__s_00 != (char *)0x0) {
    strlen(__s_00);
    LogRenderedText(ref_pos_00,(char *)in_RDX,&text_end_00->Initialized);
  }
  return;
}

Assistant:

void ImGui::LogRenderedText(const ImVec2* ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const char* prefix = g.LogNextPrefix;
    const char* suffix = g.LogNextSuffix;
    g.LogNextPrefix = g.LogNextSuffix = NULL;

    if (!text_end)
        text_end = FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos && (ref_pos->y > g.LogLinePosY + g.Style.FramePadding.y + 1);
    if (ref_pos)
        g.LogLinePosY = ref_pos->y;
    if (log_new_line)
    {
        LogText(IM_NEWLINE);
        g.LogLineFirstItem = true;
    }

    if (prefix)
        LogRenderedText(ref_pos, prefix, prefix + strlen(prefix)); // Calculate end ourself to ensure "##" are included here.

    // Re-adjust padding if we have popped out of our starting depth
    if (g.LogDepthRef > window->DC.TreeDepth)
        g.LogDepthRef = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogDepthRef);

    const char* text_remaining = text;
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by indentation corresponding to the current depth of our log entry.
        // We don't add a trailing \n yet to allow a subsequent item on the same line to be captured.
        const char* line_start = text_remaining;
        const char* line_end = ImStreolRange(line_start, text_end);
        const bool is_last_line = (line_end == text_end);
        if (line_start != line_end || !is_last_line)
        {
            const int line_length = (int)(line_end - line_start);
            const int indentation = g.LogLineFirstItem ? tree_depth * 4 : 1;
            LogText("%*s%.*s", indentation, "", line_length, line_start);
            g.LogLineFirstItem = false;
            if (*line_end == '\n')
            {
                LogText(IM_NEWLINE);
                g.LogLineFirstItem = true;
            }
        }
        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }

    if (suffix)
        LogRenderedText(ref_pos, suffix, suffix + strlen(suffix));
}